

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

bool __thiscall
Rml::DecoratorLinearGradient::Initialise
          (DecoratorLinearGradient *this,bool in_repeating,Corner in_corner,float in_angle,
          ColorStopList *in_color_stops)

{
  bool bVar1;
  ColorStopList *in_color_stops_local;
  float in_angle_local;
  Corner in_corner_local;
  bool in_repeating_local;
  DecoratorLinearGradient *this_local;
  
  this->repeating = in_repeating;
  this->corner = in_corner;
  this->angle = in_angle;
  ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
            (&this->color_stops,in_color_stops);
  bVar1 = ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::empty(&this->color_stops);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool DecoratorLinearGradient::Initialise(bool in_repeating, Corner in_corner, float in_angle, const ColorStopList& in_color_stops)
{
	repeating = in_repeating;
	corner = in_corner;
	angle = in_angle;
	color_stops = in_color_stops;
	return !color_stops.empty();
}